

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hh
# Opt level: O0

void __thiscall tchecker::syncprod::system_t::system_t(system_t *this,system_t *param_1)

{
  system_t *param_1_local;
  system_t *this_local;
  
  tchecker::system::system_t::system_t(&this->super_system_t,&param_1->super_system_t);
  labels_t::labels_t(&this->super_labels_t,&param_1->super_labels_t);
  std::
  vector<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>_>_>
  ::vector(&this->_async_outgoing_edges,&param_1->_async_outgoing_edges);
  std::
  vector<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>_>_>
  ::vector(&this->_async_incoming_edges,&param_1->_async_incoming_edges);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&this->_committed,&param_1->_committed);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_labels,&param_1->_labels);
  return;
}

Assistant:

system_t(tchecker::syncprod::system_t const &) = default;